

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tasdreamOptimizationTests.cpp
# Opt level: O0

bool TasOptimization::testParticleSwarmState(bool verbose)

{
  allocator<double> *paVar1;
  pointer *this;
  double dVar2;
  initializer_list<double> __l;
  initializer_list<double> __l_00;
  initializer_list<TasOptimization::ParticleSwarmState> __l_01;
  bool bVar3;
  int iVar4;
  reference pvVar5;
  size_type sVar6;
  size_t sVar7;
  reference pvVar8;
  reference pdVar9;
  reference rVar10;
  bool local_8c9;
  bool local_871;
  byte local_7c9;
  byte local_7a1;
  ParticleSwarmState *local_750;
  reference local_720;
  vector<bool,_std::allocator<bool>_> local_710;
  double local_6e8;
  double bp_1;
  iterator __end1_3;
  iterator __begin1_3;
  vector<double,_std::allocator<double>_> *__range1_3;
  _Bit_type local_6a8;
  reference local_6a0;
  reference local_690;
  vector<bool,_std::allocator<bool>_> local_680;
  double local_658;
  double bp;
  iterator __end1_2;
  iterator __begin1_2;
  vector<double,_std::allocator<double>_> *__range1_2;
  double v;
  iterator __end1_1;
  iterator __begin1_1;
  vector<double,_std::allocator<double>_> *__range1_1;
  double p;
  iterator __end1;
  iterator __begin1;
  vector<double,_std::allocator<double>_> *__range1;
  value_type_conflict1 local_5a8;
  undefined1 local_5a0 [8];
  vector<double,_std::allocator<double>_> ones2;
  value_type_conflict1 local_580;
  undefined1 local_578 [8];
  vector<double,_std::allocator<double>_> ones1;
  ParticleSwarmState state;
  reference local_478;
  undefined1 local_468 [8];
  vector<bool,_std::allocator<bool>_> init_vector;
  double range;
  undefined1 local_430 [4];
  int i_1;
  vector<double,_std::allocator<double>_> velocities;
  vector<double,_std::allocator<double>_> positions;
  undefined1 local_3e0 [8];
  anon_class_16_2_b54b3e13 get_rand;
  uniform_real_distribution<double> unif;
  minstd_rand park_miller;
  double local_3b0 [2];
  iterator local_3a0;
  size_type local_398;
  undefined1 local_390 [8];
  vector<double,_std::allocator<double>_> upper;
  double local_370 [2];
  iterator local_360;
  size_type local_358;
  undefined1 local_350 [8];
  vector<double,_std::allocator<double>_> lower;
  reference local_328;
  reference local_318;
  reference local_308;
  reference local_2f8;
  reference local_2e8;
  undefined1 local_2d8 [8];
  vector<bool,_std::allocator<bool>_> init_vector_1;
  vector<double,_std::allocator<double>_> local_298;
  vector<double,_std::allocator<double>_> local_280;
  vector<double,_std::allocator<double>_> local_268;
  int local_250;
  allocator<TasOptimization::ParticleSwarmState> local_249;
  int i;
  ParticleSwarmState local_240;
  ParticleSwarmState local_168;
  iterator local_90;
  size_type local_88;
  undefined1 local_80 [8];
  vector<TasOptimization::ParticleSwarmState,_std::allocator<TasOptimization::ParticleSwarmState>_>
  states;
  undefined1 local_60 [8];
  vector<double,_std::allocator<double>_> dummy_velocities;
  allocator<double> local_31;
  undefined1 local_30 [8];
  vector<double,_std::allocator<double>_> dummy_positions;
  int num_particles;
  int num_dimensions;
  test_result test;
  bool verbose_local;
  
  num_particles._3_1_ = verbose;
  test_result::test_result((test_result *)((long)&num_particles + 1));
  dummy_positions.super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage._4_4_ = 0xf;
  std::allocator<double>::allocator(&local_31);
  std::vector<double,_std::allocator<double>_>::vector
            ((vector<double,_std::allocator<double>_> *)local_30,0x1e,&local_31);
  std::allocator<double>::~allocator(&local_31);
  iVar4 = dummy_positions.super__Vector_base<double,_std::allocator<double>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage._4_4_ * 2;
  paVar1 = (allocator<double> *)
           ((long)&states.
                   super__Vector_base<TasOptimization::ParticleSwarmState,_std::allocator<TasOptimization::ParticleSwarmState>_>
                   ._M_impl.super__Vector_impl_data._M_end_of_storage + 7);
  std::allocator<double>::allocator(paVar1);
  std::vector<double,_std::allocator<double>_>::vector
            ((vector<double,_std::allocator<double>_> *)local_60,(long)iVar4,paVar1);
  std::allocator<double>::~allocator
            ((allocator<double> *)
             ((long)&states.
                     super__Vector_base<TasOptimization::ParticleSwarmState,_std::allocator<TasOptimization::ParticleSwarmState>_>
                     ._M_impl.super__Vector_impl_data._M_end_of_storage + 7));
  _i = &local_240;
  TasOptimization::ParticleSwarmState::ParticleSwarmState
            (_i,2,dummy_positions.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                  super__Vector_impl_data._M_end_of_storage._4_4_);
  _i = &local_168;
  TasOptimization::ParticleSwarmState::ParticleSwarmState
            (_i,2,(vector *)local_30,(vector *)local_60);
  local_90 = &local_240;
  local_88 = 2;
  std::allocator<TasOptimization::ParticleSwarmState>::allocator(&local_249);
  __l_01._M_len = local_88;
  __l_01._M_array = local_90;
  std::
  vector<TasOptimization::ParticleSwarmState,_std::allocator<TasOptimization::ParticleSwarmState>_>
  ::vector((vector<TasOptimization::ParticleSwarmState,_std::allocator<TasOptimization::ParticleSwarmState>_>
            *)local_80,__l_01,&local_249);
  std::allocator<TasOptimization::ParticleSwarmState>::~allocator(&local_249);
  local_750 = (ParticleSwarmState *)&local_90;
  do {
    local_750 = local_750 + -1;
    ParticleSwarmState::~ParticleSwarmState(local_750);
  } while (local_750 != &local_240);
  for (local_250 = 0; local_250 < 2; local_250 = local_250 + 1) {
    pvVar5 = std::
             vector<TasOptimization::ParticleSwarmState,_std::allocator<TasOptimization::ParticleSwarmState>_>
             ::operator[]((vector<TasOptimization::ParticleSwarmState,_std::allocator<TasOptimization::ParticleSwarmState>_>
                           *)local_80,(long)local_250);
    ParticleSwarmState::getParticlePositions(&local_268,pvVar5);
    sVar6 = std::vector<double,_std::allocator<double>_>::size(&local_268);
    sVar7 = TasGrid::Utils::size_mult<int,int>
                      (2,dummy_positions.super__Vector_base<double,_std::allocator<double>_>._M_impl
                         .super__Vector_impl_data._M_end_of_storage._4_4_);
    test_result::tassert((test_result *)((long)&num_particles + 1),sVar6 == sVar7);
    std::vector<double,_std::allocator<double>_>::~vector(&local_268);
    pvVar5 = std::
             vector<TasOptimization::ParticleSwarmState,_std::allocator<TasOptimization::ParticleSwarmState>_>
             ::operator[]((vector<TasOptimization::ParticleSwarmState,_std::allocator<TasOptimization::ParticleSwarmState>_>
                           *)local_80,(long)local_250);
    ParticleSwarmState::getParticleVelocities(&local_280,pvVar5);
    sVar6 = std::vector<double,_std::allocator<double>_>::size(&local_280);
    sVar7 = TasGrid::Utils::size_mult<int,int>
                      (2,dummy_positions.super__Vector_base<double,_std::allocator<double>_>._M_impl
                         .super__Vector_impl_data._M_end_of_storage._4_4_);
    test_result::tassert((test_result *)((long)&num_particles + 1),sVar6 == sVar7);
    std::vector<double,_std::allocator<double>_>::~vector(&local_280);
    pvVar5 = std::
             vector<TasOptimization::ParticleSwarmState,_std::allocator<TasOptimization::ParticleSwarmState>_>
             ::operator[]((vector<TasOptimization::ParticleSwarmState,_std::allocator<TasOptimization::ParticleSwarmState>_>
                           *)local_80,(long)local_250);
    ParticleSwarmState::getBestParticlePositions(&local_298,pvVar5);
    sVar6 = std::vector<double,_std::allocator<double>_>::size(&local_298);
    sVar7 = TasGrid::Utils::size_mult<int,int>
                      (2,dummy_positions.super__Vector_base<double,_std::allocator<double>_>._M_impl
                         .super__Vector_impl_data._M_end_of_storage._4_4_ + 1);
    test_result::tassert((test_result *)((long)&num_particles + 1),sVar6 == sVar7);
    std::vector<double,_std::allocator<double>_>::~vector(&local_298);
    pvVar5 = std::
             vector<TasOptimization::ParticleSwarmState,_std::allocator<TasOptimization::ParticleSwarmState>_>
             ::operator[]((vector<TasOptimization::ParticleSwarmState,_std::allocator<TasOptimization::ParticleSwarmState>_>
                           *)local_80,(long)local_250);
    ParticleSwarmState::getBestPosition
              ((vector<double,_std::allocator<double>_> *)
               &init_vector_1.super__Bvector_base<std::allocator<bool>_>._M_impl.
                super__Bvector_impl_data._M_end_of_storage,pvVar5);
    sVar6 = std::vector<double,_std::allocator<double>_>::size
                      ((vector<double,_std::allocator<double>_> *)
                       &init_vector_1.super__Bvector_base<std::allocator<bool>_>._M_impl.
                        super__Bvector_impl_data._M_end_of_storage);
    test_result::tassert((test_result *)((long)&num_particles + 1),sVar6 == 2);
    std::vector<double,_std::allocator<double>_>::~vector
              ((vector<double,_std::allocator<double>_> *)
               &init_vector_1.super__Bvector_base<std::allocator<bool>_>._M_impl.
                super__Bvector_impl_data._M_end_of_storage);
    pvVar5 = std::
             vector<TasOptimization::ParticleSwarmState,_std::allocator<TasOptimization::ParticleSwarmState>_>
             ::operator[]((vector<TasOptimization::ParticleSwarmState,_std::allocator<TasOptimization::ParticleSwarmState>_>
                           *)local_80,(long)local_250);
    ParticleSwarmState::getStateVector((vector<bool,_std::allocator<bool>_> *)local_2d8,pvVar5);
    if (local_250 == 0) {
      rVar10 = std::vector<bool,_std::allocator<bool>_>::operator[]
                         ((vector<bool,_std::allocator<bool>_> *)local_2d8,0);
      local_2e8 = rVar10;
      bVar3 = std::_Bit_reference::operator_cast_to_bool(&local_2e8);
      local_7a1 = bVar3 ^ 0xff;
    }
    else {
      rVar10 = std::vector<bool,_std::allocator<bool>_>::operator[]
                         ((vector<bool,_std::allocator<bool>_> *)local_2d8,0);
      local_2f8 = rVar10;
      local_7a1 = std::_Bit_reference::operator_cast_to_bool(&local_2f8);
    }
    test_result::tassert((test_result *)((long)&num_particles + 1),(bool)(local_7a1 & 1));
    if (local_250 == 0) {
      rVar10 = std::vector<bool,_std::allocator<bool>_>::operator[]
                         ((vector<bool,_std::allocator<bool>_> *)local_2d8,1);
      local_308 = rVar10;
      bVar3 = std::_Bit_reference::operator_cast_to_bool(&local_308);
      local_7c9 = bVar3 ^ 0xff;
    }
    else {
      rVar10 = std::vector<bool,_std::allocator<bool>_>::operator[]
                         ((vector<bool,_std::allocator<bool>_> *)local_2d8,1);
      local_318 = rVar10;
      local_7c9 = std::_Bit_reference::operator_cast_to_bool(&local_318);
    }
    test_result::tassert((test_result *)((long)&num_particles + 1),(bool)(local_7c9 & 1));
    rVar10 = std::vector<bool,_std::allocator<bool>_>::operator[]
                       ((vector<bool,_std::allocator<bool>_> *)local_2d8,2);
    local_328 = rVar10;
    bVar3 = std::_Bit_reference::operator_cast_to_bool(&local_328);
    test_result::tassert((test_result *)((long)&num_particles + 1),!bVar3);
    rVar10 = std::vector<bool,_std::allocator<bool>_>::operator[]
                       ((vector<bool,_std::allocator<bool>_> *)local_2d8,3);
    lower.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage = (pointer)rVar10._M_p;
    bVar3 = std::_Bit_reference::operator_cast_to_bool
                      ((_Bit_reference *)
                       &lower.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                        super__Vector_impl_data._M_end_of_storage);
    test_result::tassert((test_result *)((long)&num_particles + 1),!bVar3);
    std::vector<bool,_std::allocator<bool>_>::~vector
              ((vector<bool,_std::allocator<bool>_> *)local_2d8);
  }
  local_370[0] = -1.0;
  local_370[1] = 1.0;
  local_360 = local_370;
  local_358 = 2;
  paVar1 = (allocator<double> *)
           ((long)&upper.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                   super__Vector_impl_data._M_end_of_storage + 7);
  std::allocator<double>::allocator(paVar1);
  __l_00._M_len = local_358;
  __l_00._M_array = local_360;
  std::vector<double,_std::allocator<double>_>::vector
            ((vector<double,_std::allocator<double>_> *)local_350,__l_00,paVar1);
  std::allocator<double>::~allocator
            ((allocator<double> *)
             ((long)&upper.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                     super__Vector_impl_data._M_end_of_storage + 7));
  local_3b0[0] = 2.0;
  local_3b0[1] = 3.0;
  local_3a0 = local_3b0;
  local_398 = 2;
  paVar1 = (allocator<double> *)((long)&park_miller._M_x + 7);
  std::allocator<double>::allocator(paVar1);
  __l._M_len = local_398;
  __l._M_array = local_3a0;
  std::vector<double,_std::allocator<double>_>::vector
            ((vector<double,_std::allocator<double>_> *)local_390,__l,paVar1);
  std::allocator<double>::~allocator((allocator<double> *)((long)&park_miller._M_x + 7));
  std::linear_congruential_engine<unsigned_long,_48271UL,_0UL,_2147483647UL>::
  linear_congruential_engine
            ((linear_congruential_engine<unsigned_long,_48271UL,_0UL,_2147483647UL> *)
             &unif._M_param._M_b,0x2a);
  std::uniform_real_distribution<double>::uniform_real_distribution
            ((uniform_real_distribution<double> *)&get_rand.park_miller,0.0,1.0);
  local_3e0 = (undefined1  [8])&get_rand.park_miller;
  get_rand.unif = (uniform_real_distribution<double> *)&unif._M_param._M_b;
  pvVar5 = std::
           vector<TasOptimization::ParticleSwarmState,_std::allocator<TasOptimization::ParticleSwarmState>_>
           ::operator[]((vector<TasOptimization::ParticleSwarmState,_std::allocator<TasOptimization::ParticleSwarmState>_>
                         *)local_80,0);
  this = &positions.super__Vector_base<double,_std::allocator<double>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage;
  std::function<double()>::function<TasOptimization::testParticleSwarmState(bool)::__0&,void>
            ((function<double()> *)this,(anon_class_16_2_b54b3e13 *)local_3e0);
  TasOptimization::ParticleSwarmState::initializeParticlesInsideBox(pvVar5,local_350,local_390,this)
  ;
  std::function<double_()>::~function
            ((function<double_()> *)
             &positions.super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage);
  pvVar5 = std::
           vector<TasOptimization::ParticleSwarmState,_std::allocator<TasOptimization::ParticleSwarmState>_>
           ::operator[]((vector<TasOptimization::ParticleSwarmState,_std::allocator<TasOptimization::ParticleSwarmState>_>
                         *)local_80,0);
  ParticleSwarmState::getParticlePositions
            ((vector<double,_std::allocator<double>_> *)
             &velocities.super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage,pvVar5);
  pvVar5 = std::
           vector<TasOptimization::ParticleSwarmState,_std::allocator<TasOptimization::ParticleSwarmState>_>
           ::operator[]((vector<TasOptimization::ParticleSwarmState,_std::allocator<TasOptimization::ParticleSwarmState>_>
                         *)local_80,0);
  ParticleSwarmState::getParticleVelocities
            ((vector<double,_std::allocator<double>_> *)local_430,pvVar5);
  for (range._4_4_ = 0;
      range._4_4_ <
      dummy_positions.super__Vector_base<double,_std::allocator<double>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage._4_4_ * 2; range._4_4_ = range._4_4_ + 1) {
    pvVar8 = std::vector<double,_std::allocator<double>_>::operator[]
                       ((vector<double,_std::allocator<double>_> *)
                        &velocities.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                         super__Vector_impl_data._M_end_of_storage,(long)range._4_4_);
    dVar2 = *pvVar8;
    pvVar8 = std::vector<double,_std::allocator<double>_>::operator[]
                       ((vector<double,_std::allocator<double>_> *)local_350,(long)(range._4_4_ % 2)
                       );
    test_result::tassert((test_result *)((long)&num_particles + 1),*pvVar8 + -1e-12 <= dVar2);
    pvVar8 = std::vector<double,_std::allocator<double>_>::operator[]
                       ((vector<double,_std::allocator<double>_> *)
                        &velocities.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                         super__Vector_impl_data._M_end_of_storage,(long)range._4_4_);
    dVar2 = *pvVar8;
    pvVar8 = std::vector<double,_std::allocator<double>_>::operator[]
                       ((vector<double,_std::allocator<double>_> *)local_390,(long)(range._4_4_ % 2)
                       );
    test_result::tassert((test_result *)((long)&num_particles + 1),dVar2 <= *pvVar8 + 1e-12);
    pvVar8 = std::vector<double,_std::allocator<double>_>::operator[]
                       ((vector<double,_std::allocator<double>_> *)local_390,(long)(range._4_4_ % 2)
                       );
    dVar2 = *pvVar8;
    pvVar8 = std::vector<double,_std::allocator<double>_>::operator[]
                       ((vector<double,_std::allocator<double>_> *)local_350,(long)(range._4_4_ % 2)
                       );
    init_vector.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
    _M_end_of_storage = (_Bit_pointer)ABS(dVar2 - *pvVar8);
    pvVar8 = std::vector<double,_std::allocator<double>_>::operator[]
                       ((vector<double,_std::allocator<double>_> *)local_430,(long)range._4_4_);
    test_result::tassert
              ((test_result *)((long)&num_particles + 1),
               -1e-12 - (double)init_vector.super__Bvector_base<std::allocator<bool>_>._M_impl.
                                super__Bvector_impl_data._M_end_of_storage <= *pvVar8);
    pvVar8 = std::vector<double,_std::allocator<double>_>::operator[]
                       ((vector<double,_std::allocator<double>_> *)local_430,(long)range._4_4_);
    test_result::tassert
              ((test_result *)((long)&num_particles + 1),
               *pvVar8 <=
               (double)init_vector.super__Bvector_base<std::allocator<bool>_>._M_impl.
                       super__Bvector_impl_data._M_end_of_storage + 1e-12);
  }
  pvVar5 = std::
           vector<TasOptimization::ParticleSwarmState,_std::allocator<TasOptimization::ParticleSwarmState>_>
           ::operator[]((vector<TasOptimization::ParticleSwarmState,_std::allocator<TasOptimization::ParticleSwarmState>_>
                         *)local_80,0);
  ParticleSwarmState::getStateVector((vector<bool,_std::allocator<bool>_> *)local_468,pvVar5);
  local_478 = std::vector<bool,_std::allocator<bool>_>::operator[]
                        ((vector<bool,_std::allocator<bool>_> *)local_468,0);
  bVar3 = std::_Bit_reference::operator_cast_to_bool(&local_478);
  local_871 = false;
  if (bVar3) {
    rVar10 = std::vector<bool,_std::allocator<bool>_>::operator[]
                       ((vector<bool,_std::allocator<bool>_> *)local_468,1);
    state.cache_best_particle_inside.super__Bvector_base<std::allocator<bool>_>._M_impl.
    super__Bvector_impl_data._M_end_of_storage = rVar10._M_p;
    local_871 = std::_Bit_reference::operator_cast_to_bool
                          ((_Bit_reference *)
                           &state.cache_best_particle_inside.
                            super__Bvector_base<std::allocator<bool>_>._M_impl.
                            super__Bvector_impl_data._M_end_of_storage);
  }
  test_result::tassert((test_result *)((long)&num_particles + 1),local_871);
  TasOptimization::ParticleSwarmState::ParticleSwarmState
            ((ParticleSwarmState *)
             &ones1.super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage,2,
             dummy_positions.super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_end_of_storage._4_4_);
  iVar4 = dummy_positions.super__Vector_base<double,_std::allocator<double>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage._4_4_ * 2;
  local_580 = 1.0;
  paVar1 = (allocator<double> *)
           ((long)&ones2.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                   super__Vector_impl_data._M_end_of_storage + 7);
  std::allocator<double>::allocator(paVar1);
  std::vector<double,_std::allocator<double>_>::vector
            ((vector<double,_std::allocator<double>_> *)local_578,(long)iVar4,&local_580,paVar1);
  std::allocator<double>::~allocator
            ((allocator<double> *)
             ((long)&ones2.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                     super__Vector_impl_data._M_end_of_storage + 7));
  iVar4 = dummy_positions.super__Vector_base<double,_std::allocator<double>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage._4_4_ + 1;
  local_5a8 = 1.0;
  std::allocator<double>::allocator((allocator<double> *)((long)&__range1 + 7));
  std::vector<double,_std::allocator<double>_>::vector
            ((vector<double,_std::allocator<double>_> *)local_5a0,(long)(iVar4 * 2),&local_5a8,
             (allocator<double> *)((long)&__range1 + 7));
  std::allocator<double>::~allocator((allocator<double> *)((long)&__range1 + 7));
  ParticleSwarmState::setParticlePositions
            ((ParticleSwarmState *)
             &ones1.super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage,
             (vector<double,_std::allocator<double>_> *)local_578);
  ParticleSwarmState::getParticlePositions
            ((vector<double,_std::allocator<double>_> *)&__begin1,
             (ParticleSwarmState *)
             &ones1.super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage);
  __end1 = std::vector<double,_std::allocator<double>_>::begin
                     ((vector<double,_std::allocator<double>_> *)&__begin1);
  p = (double)std::vector<double,_std::allocator<double>_>::end
                        ((vector<double,_std::allocator<double>_> *)&__begin1);
  while( true ) {
    bVar3 = __gnu_cxx::operator!=
                      (&__end1,(__normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_>
                                *)&p);
    if (!bVar3) break;
    pdVar9 = __gnu_cxx::__normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_>::
             operator*(&__end1);
    test_result::tassert((test_result *)((long)&num_particles + 1),(bool)(-(*pdVar9 == 1.0) & 1));
    __gnu_cxx::__normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_>::
    operator++(&__end1);
  }
  std::vector<double,_std::allocator<double>_>::~vector
            ((vector<double,_std::allocator<double>_> *)&__begin1);
  ParticleSwarmState::setParticleVelocities
            ((ParticleSwarmState *)
             &ones1.super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage,
             (vector<double,_std::allocator<double>_> *)local_578);
  ParticleSwarmState::getParticleVelocities
            ((vector<double,_std::allocator<double>_> *)&__begin1_1,
             (ParticleSwarmState *)
             &ones1.super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage);
  __end1_1 = std::vector<double,_std::allocator<double>_>::begin
                       ((vector<double,_std::allocator<double>_> *)&__begin1_1);
  v = (double)std::vector<double,_std::allocator<double>_>::end
                        ((vector<double,_std::allocator<double>_> *)&__begin1_1);
  while( true ) {
    bVar3 = __gnu_cxx::operator!=
                      (&__end1_1,
                       (__normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_> *
                       )&v);
    if (!bVar3) break;
    pdVar9 = __gnu_cxx::__normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_>::
             operator*(&__end1_1);
    test_result::tassert((test_result *)((long)&num_particles + 1),(bool)(-(*pdVar9 == 1.0) & 1));
    __gnu_cxx::__normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_>::
    operator++(&__end1_1);
  }
  std::vector<double,_std::allocator<double>_>::~vector
            ((vector<double,_std::allocator<double>_> *)&__begin1_1);
  ParticleSwarmState::setBestParticlePositions
            ((ParticleSwarmState *)
             &ones1.super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage,
             (vector<double,_std::allocator<double>_> *)local_5a0);
  ParticleSwarmState::getBestParticlePositions
            ((vector<double,_std::allocator<double>_> *)&__begin1_2,
             (ParticleSwarmState *)
             &ones1.super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage);
  __end1_2 = std::vector<double,_std::allocator<double>_>::begin
                       ((vector<double,_std::allocator<double>_> *)&__begin1_2);
  bp = (double)std::vector<double,_std::allocator<double>_>::end
                         ((vector<double,_std::allocator<double>_> *)&__begin1_2);
  while( true ) {
    bVar3 = __gnu_cxx::operator!=
                      (&__end1_2,
                       (__normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_> *
                       )&bp);
    if (!bVar3) break;
    pdVar9 = __gnu_cxx::__normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_>::
             operator*(&__end1_2);
    local_658 = *pdVar9;
    test_result::tassert((test_result *)((long)&num_particles + 1),(bool)(-(local_658 == 1.0) & 1));
    __gnu_cxx::__normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_>::
    operator++(&__end1_2);
  }
  std::vector<double,_std::allocator<double>_>::~vector
            ((vector<double,_std::allocator<double>_> *)&__begin1_2);
  ParticleSwarmState::getStateVector
            (&local_680,
             (ParticleSwarmState *)
             &ones1.super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage);
  std::vector<bool,_std::allocator<bool>_>::operator=
            ((vector<bool,_std::allocator<bool>_> *)local_468,&local_680);
  std::vector<bool,_std::allocator<bool>_>::~vector(&local_680);
  local_690 = std::vector<bool,_std::allocator<bool>_>::operator[]
                        ((vector<bool,_std::allocator<bool>_> *)local_468,0);
  bVar3 = std::_Bit_reference::operator_cast_to_bool(&local_690);
  local_8c9 = false;
  if (bVar3) {
    local_6a0 = std::vector<bool,_std::allocator<bool>_>::operator[]
                          ((vector<bool,_std::allocator<bool>_> *)local_468,1);
    bVar3 = std::_Bit_reference::operator_cast_to_bool(&local_6a0);
    local_8c9 = false;
    if (bVar3) {
      rVar10 = std::vector<bool,_std::allocator<bool>_>::operator[]
                         ((vector<bool,_std::allocator<bool>_> *)local_468,2);
      local_6a8 = rVar10._M_mask;
      __range1_3 = (vector<double,_std::allocator<double>_> *)rVar10._M_p;
      local_8c9 = std::_Bit_reference::operator_cast_to_bool((_Bit_reference *)&__range1_3);
    }
  }
  test_result::tassert((test_result *)((long)&num_particles + 1),local_8c9);
  ParticleSwarmState::clearBestParticles
            ((ParticleSwarmState *)
             &ones1.super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage);
  pvVar5 = std::
           vector<TasOptimization::ParticleSwarmState,_std::allocator<TasOptimization::ParticleSwarmState>_>
           ::operator[]((vector<TasOptimization::ParticleSwarmState,_std::allocator<TasOptimization::ParticleSwarmState>_>
                         *)local_80,0);
  ParticleSwarmState::getBestParticlePositions
            ((vector<double,_std::allocator<double>_> *)&__begin1_3,pvVar5);
  __end1_3 = std::vector<double,_std::allocator<double>_>::begin
                       ((vector<double,_std::allocator<double>_> *)&__begin1_3);
  bp_1 = (double)std::vector<double,_std::allocator<double>_>::end
                           ((vector<double,_std::allocator<double>_> *)&__begin1_3);
  while( true ) {
    bVar3 = __gnu_cxx::operator!=
                      (&__end1_3,
                       (__normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_> *
                       )&bp_1);
    if (!bVar3) break;
    pdVar9 = __gnu_cxx::__normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_>::
             operator*(&__end1_3);
    local_6e8 = *pdVar9;
    test_result::tassert((test_result *)((long)&num_particles + 1),(bool)(-(local_6e8 == 0.0) & 1));
    __gnu_cxx::__normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_>::
    operator++(&__end1_3);
  }
  std::vector<double,_std::allocator<double>_>::~vector
            ((vector<double,_std::allocator<double>_> *)&__begin1_3);
  ParticleSwarmState::getStateVector
            (&local_710,
             (ParticleSwarmState *)
             &ones1.super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage);
  std::vector<bool,_std::allocator<bool>_>::operator=
            ((vector<bool,_std::allocator<bool>_> *)local_468,&local_710);
  std::vector<bool,_std::allocator<bool>_>::~vector(&local_710);
  local_720 = std::vector<bool,_std::allocator<bool>_>::operator[]
                        ((vector<bool,_std::allocator<bool>_> *)local_468,2);
  bVar3 = std::_Bit_reference::operator_cast_to_bool(&local_720);
  test_result::tassert((test_result *)((long)&num_particles + 1),!bVar3);
  bVar3 = test_result::failed_any((test_result *)((long)&num_particles + 1));
  if ((bVar3) || ((num_particles._3_1_ & 1) != 0)) {
    bVar3 = test_result::success((test_result *)((long)&num_particles + 1));
    reportPassFail(bVar3,"Particle Swarm","State Unit Tests");
  }
  bVar3 = test_result::success((test_result *)((long)&num_particles + 1));
  std::vector<double,_std::allocator<double>_>::~vector
            ((vector<double,_std::allocator<double>_> *)local_5a0);
  std::vector<double,_std::allocator<double>_>::~vector
            ((vector<double,_std::allocator<double>_> *)local_578);
  ParticleSwarmState::~ParticleSwarmState
            ((ParticleSwarmState *)
             &ones1.super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage);
  std::vector<bool,_std::allocator<bool>_>::~vector
            ((vector<bool,_std::allocator<bool>_> *)local_468);
  std::vector<double,_std::allocator<double>_>::~vector
            ((vector<double,_std::allocator<double>_> *)local_430);
  std::vector<double,_std::allocator<double>_>::~vector
            ((vector<double,_std::allocator<double>_> *)
             &velocities.super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage);
  std::vector<double,_std::allocator<double>_>::~vector
            ((vector<double,_std::allocator<double>_> *)local_390);
  std::vector<double,_std::allocator<double>_>::~vector
            ((vector<double,_std::allocator<double>_> *)local_350);
  std::
  vector<TasOptimization::ParticleSwarmState,_std::allocator<TasOptimization::ParticleSwarmState>_>
  ::~vector((vector<TasOptimization::ParticleSwarmState,_std::allocator<TasOptimization::ParticleSwarmState>_>
             *)local_80);
  std::vector<double,_std::allocator<double>_>::~vector
            ((vector<double,_std::allocator<double>_> *)local_60);
  std::vector<double,_std::allocator<double>_>::~vector
            ((vector<double,_std::allocator<double>_> *)local_30);
  return bVar3;
}

Assistant:

bool testParticleSwarmState(bool verbose) {
    test_result test;

    // Check size of the accessible vectors generated by different constructors.
    int num_dimensions = 2;
    int num_particles = 15;
    std::vector<double> dummy_positions(num_dimensions * num_particles);
    std::vector<double> dummy_velocities(num_dimensions * num_particles);
    std::vector<ParticleSwarmState> states = {
        ParticleSwarmState(num_dimensions, num_particles),
        ParticleSwarmState(num_dimensions, std::move(dummy_positions), std::move(dummy_velocities))
    };
    for (int i=0; i<2; i++) {
        test.tassert(states[i].getParticlePositions().size() == Utils::size_mult(num_dimensions, num_particles));
        test.tassert(states[i].getParticleVelocities().size() == Utils::size_mult(num_dimensions, num_particles));
        test.tassert(states[i].getBestParticlePositions().size() == Utils::size_mult(num_dimensions, num_particles+1));
        test.tassert(states[i].getBestPosition().size() == (size_t) num_dimensions);
        std::vector<bool> init_vector = states[i].getStateVector();
        test.tassert(i == 0 ? not init_vector[0] : init_vector[0]);
        test.tassert(i == 0 ? not init_vector[1] : init_vector[1]);
        test.tassert(not init_vector[2]);
        test.tassert(not init_vector[3]);
    }

    // Check TasOptimization::ParticleSwarmState::initializeParticlesInsideBox().
    std::vector<double> lower = {-1.0, 1.0};
    std::vector<double> upper = {2.0, 3.0};
    std::minstd_rand park_miller(42);
    std::uniform_real_distribution<double> unif(0.0, 1.0);
    auto get_rand = [&]()->double{ return unif(park_miller); };
    states[0].initializeParticlesInsideBox(lower, upper, get_rand);
    std::vector<double> positions = states[0].getParticlePositions();
    std::vector<double> velocities = states[0].getParticleVelocities();
    for (int i=0; i<num_particles * num_dimensions; i++) {
        test.tassert(positions[i] >= lower[i % num_dimensions] - TasGrid::Maths::num_tol);
        test.tassert(positions[i] <= upper[i % num_dimensions] + TasGrid::Maths::num_tol);
        double range = fabs(upper[i % num_dimensions] - lower[i % num_dimensions]);
        test.tassert(velocities[i] >= -range - TasGrid::Maths::num_tol);
        test.tassert(velocities[i] <=  range + TasGrid::Maths::num_tol);
    }
    std::vector<bool> init_vector = states[0].getStateVector();
    test.tassert(init_vector[0] and init_vector[1]);

    // Check the nontrivial setters.
    ParticleSwarmState state(num_dimensions, num_particles);
    std::vector<double> ones1(num_dimensions * num_particles, 1);
    std::vector<double> ones2(num_dimensions * (num_particles + 1), 1);
    state.setParticlePositions(ones1);
    for (auto p : state.getParticlePositions()) test.tassert(p == 1);
    state.setParticleVelocities(ones1);
    for (auto v : state.getParticleVelocities()) test.tassert(v == 1);
    state.setBestParticlePositions(ones2);
    for (auto bp : state.getBestParticlePositions()) test.tassert(bp == 1);
    init_vector = state.getStateVector();
    test.tassert(init_vector[0] and init_vector[1] and init_vector[2]);

    // Check TasOptimization::ParticleSwarmState::clearBestParticles().
    state.clearBestParticles();
    for (auto bp : states[0].getBestParticlePositions()) test.tassert(bp == 0);
    init_vector = state.getStateVector();
    test.tassert(not init_vector[2]);

    // Reporting.
    if (test.failed_any() or verbose) reportPassFail(test.success(), "Particle Swarm", "State Unit Tests");
    return test.success();
}